

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

int protect_resize_help(refs_table_t *tbl)

{
  size_t *psVar1;
  ulong uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong *puVar9;
  int iVar10;
  ulong *puVar11;
  
  iVar6 = 0;
  if (((0xfffffff < tbl->refs_control) && (iVar6 = 1, -1 < (int)tbl->refs_control)) &&
     (tbl->refs_resize_part < tbl->refs_resize_size >> 7)) {
    LOCK();
    psVar1 = &tbl->refs_resize_part;
    uVar2 = *psVar1;
    *psVar1 = *psVar1 + 1;
    UNLOCK();
    if (uVar2 < tbl->refs_resize_size >> 7) {
      puVar9 = tbl->refs_resize_table + uVar2 * 0x80;
      iVar10 = 0;
      do {
        uVar2 = *puVar9;
        if ((uVar2 != 0) && (uVar2 != 0x7fffffffffffffff)) {
          uVar7 = ((uVar2 >> 0x27 | uVar2 << 0x19) ^ (uVar2 ^ 0xcbf29ce484222325) * 0x100000001b3) *
                  0x100000001b3;
          puVar3 = tbl->refs_table;
          uVar4 = tbl->refs_size;
          puVar11 = puVar3 + (uVar7 >> 0x20 ^ uVar7) % uVar4;
          iVar8 = -0x81;
          do {
            iVar8 = iVar8 + 1;
            if (iVar8 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                            ,0x168,"void protect_rehash(refs_table_t *, uint64_t)");
            }
            if (*puVar11 == 0) {
              bVar5 = false;
              LOCK();
              uVar7 = *puVar11;
              if (uVar7 == 0) {
                *puVar11 = uVar2;
              }
              UNLOCK();
              if (uVar7 != 0) goto LAB_00113adf;
            }
            else {
LAB_00113adf:
              puVar11 = puVar11 + 1;
              bVar5 = true;
              if (puVar11 == puVar3 + uVar4) {
                puVar11 = tbl->refs_table;
              }
            }
          } while (bVar5);
        }
        puVar9 = puVar9 + 1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x80);
      LOCK();
      tbl->refs_resize_done = tbl->refs_resize_done + 1;
      UNLOCK();
    }
  }
  return iVar6;
}

Assistant:

static int
protect_resize_help(refs_table_t *tbl)
{
    if (0 == (tbl->refs_control & 0xf0000000)) return 0; // no resize in progress (anymore)
    if (tbl->refs_control & 0x80000000) return 1; // still waiting for preparation
    if (tbl->refs_resize_part >= tbl->refs_resize_size / 128) return 1; // all parts claimed
    size_t part = atomic_fetch_add(&tbl->refs_resize_part, 1);
    if (part >= tbl->refs_resize_size/128) return 1; // all parts claimed

    // rehash all
    int i;
    _Atomic(uint64_t)* bucket = tbl->refs_resize_table + part * 128;
    for (i=0; i<128; i++) protect_rehash(tbl, *bucket++);

    atomic_fetch_add(&tbl->refs_resize_done, 1);
    return 1;
}